

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassConstructor
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  Descriptor *pDVar1;
  bool bVar2;
  string *args_3;
  ulong uVar3;
  char *pcVar4;
  char *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  Descriptor *desc_00;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *desc_01;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  byte local_bb;
  allocator local_ba;
  byte local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string message_id;
  string local_48;
  GeneratorOptions *local_28;
  Descriptor *desc_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_28 = (GeneratorOptions *)desc;
  desc_local = (Descriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  (anonymous_namespace)::GetMessagePathPrefix_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  args_3 = Descriptor::name_abi_cxx11_((Descriptor *)local_28);
  args_1 = (char *)&local_48;
  io::Printer::Print<char[12],std::__cxx11::string,char[10],std::__cxx11::string>
            (printer,
             "/**\n * Generated by JsPbCodeGenerator.\n * @param {Array=} opt_data Optional initial data array, typically from a\n * server response, or constructed directly in Javascript. The array is used\n * in place and becomes part of the constructed object. It is not cloned.\n * If no data is provided, the constructed object will be empty, but still\n * valid.\n * @extends {jspb.Message}\n * @constructor\n */\n$classprefix$$classname$ = function(opt_data) {\n"
             ,(char (*) [12])"classprefix",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
             (char (*) [10])0x77c586,args_3);
  std::__cxx11::string::~string((string *)&local_48);
  io::Printer::Annotate<google::protobuf::Descriptor>
            ((Printer *)desc_local,"classname",(Descriptor *)local_28);
  (anonymous_namespace)::GetMessageId_abi_cxx11_
            ((string *)local_78,(_anonymous_namespace_ *)local_28,desc_00);
  pDVar1 = desc_local;
  uVar3 = std::__cxx11::string::empty();
  local_b9 = 0;
  local_bb = 0;
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_b8,"\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    local_b9 = 1;
    std::operator+(&local_98,&local_b8,"\'");
    desc_01 = extraout_RDX;
  }
  else {
    bVar2 = anon_unknown_0::IsResponse((Descriptor *)local_28);
    args_1 = "\'\'";
    pcVar4 = "0";
    if (bVar2) {
      pcVar4 = "\'\'";
    }
    std::allocator<char>::allocator();
    local_bb = 1;
    std::__cxx11::string::string((string *)&local_98,pcVar4,&local_ba);
    desc_01 = extraout_RDX_00;
  }
  (anonymous_namespace)::GetPivot_abi_cxx11_(&local_e0,(_anonymous_namespace_ *)local_28,desc_01);
  (anonymous_namespace)::RepeatedFieldsArrayName_abi_cxx11_
            (&local_100,(_anonymous_namespace_ *)printer_local,local_28,(Descriptor *)args_1);
  (anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
            (&local_120,(_anonymous_namespace_ *)printer_local,local_28,(Descriptor *)args_1);
  args_1_00 = &local_98;
  io::Printer::
  Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[12],std::__cxx11::string>
            ((Printer *)pDVar1,
             "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, $rptfields$, $oneoffields$);\n"
             ,(char (*) [10])"messageId",args_1_00,(char (*) [6])"pivot",&local_e0,
             (char (*) [10])"rptfields",&local_100,(char (*) [12])"oneoffields",&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_98);
  if ((local_bb & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_ba);
  }
  if ((local_b9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b8);
  }
  pDVar1 = desc_local;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_140,(_anonymous_namespace_ *)printer_local,local_28,(Descriptor *)args_1_00);
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)pDVar1,
             "};\ngoog.inherits($classname$, jspb.Message);\nif (goog.DEBUG && !COMPILED) {\n  /**\n   * @public\n   * @override\n   */\n  $classname$.displayName = \'$classname$\';\n}\n"
             ,(char (*) [10])0x77c586,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void Generator::GenerateClassConstructor(const GeneratorOptions& options,
                                         io::Printer* printer,
                                         const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Generated by JsPbCodeGenerator.\n"
      " * @param {Array=} opt_data Optional initial data array, typically "
      "from a\n"
      " * server response, or constructed directly in Javascript. The array "
      "is used\n"
      " * in place and becomes part of the constructed object. It is not "
      "cloned.\n"
      " * If no data is provided, the constructed object will be empty, but "
      "still\n"
      " * valid.\n"
      " * @extends {jspb.Message}\n"
      " * @constructor\n"
      " */\n"
      "$classprefix$$classname$ = function(opt_data) {\n",
      "classprefix", GetMessagePathPrefix(options, desc), "classname",
      desc->name());
  printer->Annotate("classname", desc);
  std::string message_id = GetMessageId(desc);
  printer->Print(
      "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, "
      "$rptfields$, $oneoffields$);\n",
      "messageId",
      !message_id.empty() ? ("'" + message_id + "'")
                          : (IsResponse(desc) ? "''" : "0"),
      "pivot", GetPivot(desc), "rptfields",
      RepeatedFieldsArrayName(options, desc), "oneoffields",
      OneofFieldsArrayName(options, desc));
  printer->Print(
      "};\n"
      "goog.inherits($classname$, jspb.Message);\n"
      "if (goog.DEBUG && !COMPILED) {\n"
      // displayName overrides Function.prototype.displayName
      // http://google3/javascript/externs/es3.js?l=511
      "  /**\n"
      "   * @public\n"
      "   * @override\n"
      "   */\n"
      "  $classname$.displayName = '$classname$';\n"
      "}\n",
      "classname", GetMessagePath(options, desc));
}